

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple16.h
# Opt level: O0

void FastPForLib::Simple16<true>::unpack6_3_5_2(uint32_t **out,uint32_t **in)

{
  uint *puVar1;
  uint *puVar2;
  uint32_t *pin;
  uint32_t *pout;
  uint32_t **in_local;
  uint32_t **out_local;
  
  puVar1 = *out;
  puVar2 = *in;
  *puVar1 = *puVar2 >> 0x16 & 0x3f;
  puVar1[1] = *puVar2 >> 0x10 & 0x3f;
  puVar1[2] = *puVar2 >> 10 & 0x3f;
  puVar1[3] = *puVar2 >> 5 & 0x1f;
  puVar1[4] = *puVar2 & 0x1f;
  *in = puVar2 + 1;
  *out = puVar1 + 5;
  return;
}

Assistant:

void Simple16<MarkLength>::unpack6_3_5_2(uint32_t **out, const uint32_t **in) {
  uint32_t *pout;
  const uint32_t *pin;

  pout = *out;
  pin = *in;

  pout[0] = (pin[0] >> 22) & 0x3f;
  pout[1] = (pin[0] >> 16) & 0x3f;
  pout[2] = (pin[0] >> 10) & 0x3f;

  pout[3] = (pin[0] >> 5) & 0x1f;
  pout[4] = pin[0] & 0x1f;

  *in = pin + 1;
  *out = pout + 5;
}